

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O2

span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> __thiscall
pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+
          (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *this,difference_type n)

{
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *other;
  difference_type in_RDX;
  ptrdiff_t extraout_RDX;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> sVar1;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> ret;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> sStack_28;
  
  span_iterator(&sStack_28,(span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)n);
  other = operator+=(&sStack_28,in_RDX);
  span_iterator(this,other);
  sVar1.index_ = extraout_RDX;
  sVar1.span_ = (span<unsigned_char,__1L> *)this;
  return sVar1;
}

Assistant:

span_iterator operator+ (difference_type n) const noexcept {
                    auto ret = *this;
                    return ret += n;
                }